

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  TestLog *pTVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar8;
  pointer pcVar9;
  byte bVar10;
  Vector<tcu::Interval,_2> *pVVar11;
  long lVar12;
  pointer pMVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  _Rb_tree_node_base *p_Var17;
  IVal *pIVar18;
  long lVar19;
  long *plVar20;
  Matrix<float,_2,_2> *val;
  byte bVar21;
  FloatFormat *pFVar22;
  _Base_ptr p_Var23;
  Matrix<tcu::Interval,_2,_2> *ival;
  _Base_ptr p_Var24;
  TestStatus *pTVar25;
  IVal reference1;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  IVal in0;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  void *outputArr [2];
  FloatFormat highpFmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  IVal local_571;
  undefined1 local_570 [8];
  float local_568;
  float fStack_564;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  TestLog *local_550;
  size_t local_548;
  ulong local_540;
  FloatFormat *local_538;
  long local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [24];
  double local_500;
  TestStatus *local_4c8;
  string local_4c0;
  long local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double dStack_478;
  Precision local_470;
  undefined4 uStack_46c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  double local_458;
  Interval local_450;
  ios_base local_428 [8];
  ios_base local_420 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_318;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  FloatFormat local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [48];
  undefined1 local_178 [328];
  
  this_00 = this->m_samplings;
  pFVar22 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_538 = pFVar22;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar22,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  pMVar13 = local_278.in0.
            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_548);
  local_2a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_498 + 8);
  local_498._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_528 + 8);
  local_528._8_4_ = _S_red;
  local_518._0_8_ = (_Base_ptr)0x0;
  local_500 = 0.0;
  pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_518._8_8_ = p_Var2;
  local_518._16_8_ = p_Var2;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_528);
  if ((_Rb_tree_node_base *)local_518._8_8_ != p_Var2) {
    p_Var17 = (_Rb_tree_node_base *)local_518._8_8_;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1a8);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var2);
  }
  pFVar22 = local_538;
  if (local_500 != 0.0) {
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)CONCAT44(local_570._4_4_,local_570._0_4_),
               CONCAT44(fStack_564,local_568));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_570._4_4_,local_570._0_4_) != &local_560) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_570._4_4_,local_570._0_4_),
                      local_560._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_528);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_548,&local_218,&local_2b8,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_498);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_318,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_570);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_318,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_571);
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
LAB_0097ea49:
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar25 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_420);
    local_498._0_8_ = (IVal *)(local_498 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar25->m_code = QP_TEST_RESULT_PASS;
    (pTVar25->m_description)._M_dataplus._M_p = (pointer)&(pTVar25->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar25->m_description,local_498._0_8_,
               (pointer)(local_498._0_8_ + CONCAT44(local_498._12_4_,local_498._8_4_)));
    if ((IVal *)local_498._0_8_ == (IVal *)(local_498 + 0x10)) goto LAB_0097ec30;
    p_Var23 = (_Base_ptr)
              CONCAT44(local_488._M_allocated_capacity._4_4_,local_488._M_allocated_capacity._0_4_);
    pIVar18 = (IVal *)local_498._0_8_;
  }
  else {
    local_4a0 = local_548 + (local_548 == 0);
    local_530 = 0;
    local_540 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      lVar12 = local_530;
      local_570._0_4_ =
           local_278.in0.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[local_530].m_data.m_data[0].m_data[0];
      local_568 = local_278.in0.
                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_530].m_data.m_data[1].m_data[0];
      local_570._4_4_ =
           local_278.in0.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[local_530].m_data.m_data[0].m_data[1];
      fStack_564 = local_278.in0.
                   super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_530].m_data.m_data[1].m_data[1];
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                ((IVal *)local_528,pFVar22,(Matrix<float,_2,_2> *)local_570);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_498,pFVar22,(IVal *)local_528);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_318,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      (pIVar18->m_data).m_data[0].m_data[0].m_hi =
           (double)CONCAT44(local_488._M_allocated_capacity._4_4_,
                            local_488._M_allocated_capacity._0_4_);
      *(undefined8 *)(pIVar18->m_data).m_data[0].m_data = local_498._0_8_;
      (pIVar18->m_data).m_data[0].m_data[0].m_lo =
           (double)CONCAT44(local_498._12_4_,local_498._8_4_);
      (pIVar18->m_data).m_data[1].m_data[0].m_hi = local_458;
      *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
        **)(pIVar18->m_data).m_data[1].m_data = local_468;
      (pIVar18->m_data).m_data[1].m_data[0].m_lo = (double)CONCAT44(uStack_45c,uStack_460);
      *(ulong *)((pIVar18->m_data).m_data[0].m_data + 1) =
           CONCAT44(local_488._12_4_,local_488._8_4_);
      (pIVar18->m_data).m_data[0].m_data[1].m_lo = dStack_478;
      (pIVar18->m_data).m_data[0].m_data[1].m_hi = (double)CONCAT44(uStack_46c,local_470);
      pVVar11 = (pIVar18->m_data).m_data;
      pVVar11[1].m_data[1].m_hasNaN = local_450.m_hasNaN;
      *(undefined7 *)&pVVar11[1].m_data[1].field_0x1 = local_450._1_7_;
      (pIVar18->m_data).m_data[1].m_data[1].m_lo = local_450.m_lo;
      (pIVar18->m_data).m_data[1].m_data[1].m_hi = local_450.m_hi;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      dStack_478 = pFVar22->m_maxValue;
      local_498._0_8_ = *(undefined8 *)pFVar22;
      local_498._8_4_ = pFVar22->m_fractionBits;
      local_498._12_4_ = pFVar22->m_hasSubnormal;
      local_488._M_allocated_capacity._0_4_ = pFVar22->m_hasInf;
      local_488._M_allocated_capacity._4_4_ = pFVar22->m_hasNaN;
      local_488._8_1_ = pFVar22->m_exactPrecision;
      local_488._9_3_ = *(undefined3 *)&pFVar22->field_0x19;
      local_488._12_4_ = *(undefined4 *)&pFVar22->field_0x1c;
      uStack_460 = 0;
      pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_318;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(IVal *)local_498);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_318,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_498,&local_2a8,pIVar18);
      pMVar13 = local_2e8.out0.
                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._16_8_ =
           CONCAT44(local_488._M_allocated_capacity._4_4_,local_488._M_allocated_capacity._0_4_);
      local_1a8._8_8_ = CONCAT44(local_498._12_4_,local_498._8_4_);
      local_1a8._0_8_ = local_498._0_8_;
      local_178._16_8_ = local_458;
      local_178._8_8_ = CONCAT44(uStack_45c,uStack_460);
      local_178._0_8_ = local_468;
      local_1a8._40_8_ = CONCAT44(uStack_46c,local_470);
      local_1a8._24_8_ = CONCAT44(local_488._12_4_,local_488._8_4_);
      local_1a8._32_8_ = dStack_478;
      local_178._40_8_ = local_450.m_hi;
      local_178._24_8_ = local_450._0_8_;
      local_178._32_8_ = local_450.m_lo;
      bVar21 = 1;
      lVar19 = 0;
      ival = (Matrix<tcu::Interval,_2,_2> *)local_1a8;
      do {
        bVar14 = contains<tcu::Vector<float,2>>((IVal *)ival,pMVar13[lVar12].m_data.m_data + lVar19)
        ;
        lVar19 = 1;
        bVar10 = bVar21 & bVar14;
        bVar21 = 0;
        ival = (Matrix<tcu::Interval,_2,_2> *)local_178;
      } while (bVar10 != 0);
      local_498._0_8_ = local_498 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_498);
      if ((TestLog *)local_498._0_8_ != (TestLog *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,
                        CONCAT44(local_488._M_allocated_capacity._4_4_,
                                 local_488._M_allocated_capacity._0_4_) + 1);
      }
      pFVar22 = local_538;
      if (!bVar14) {
        uVar16 = (int)local_540 + 1;
        local_540 = (ulong)uVar16;
        poVar3 = (ostringstream *)(local_498 + 8);
        if ((int)uVar16 < 0x65) {
          local_498._0_8_ = local_550;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                   m_ptr;
          val = (Matrix<float,_2,_2> *)(local_528 + 0x10);
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_528._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_528,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_528._0_8_,
                     CONCAT44(local_528._12_4_,local_528._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_570,(shaderexecutor *)&local_2a8,
                     (FloatFormat *)
                     (local_278.in0.
                      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar12),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)CONCAT44(local_570._4_4_,local_570._0_4_),
                     CONCAT44(fStack_564,local_568));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_570._4_4_,local_570._0_4_) != &local_560) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_570._4_4_,local_570._0_4_),
                            local_560._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_2> *)local_528._0_8_ != (Matrix<float,_2,_2> *)(local_528 + 0x10)) {
            operator_delete((void *)local_528._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_518._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                   m_ptr;
          pIVar18 = (IVal *)(local_528 + 0x10);
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_528._0_8_ = pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_528,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_528._0_8_,
                     CONCAT44(local_528._12_4_,local_528._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_570,(shaderexecutor *)&local_2a8,
                     (FloatFormat *)
                     (local_2e8.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar12),
                     (Matrix<float,_2,_2> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)CONCAT44(local_570._4_4_,local_570._0_4_),
                     CONCAT44(fStack_564,local_568));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,2>>
                    (&local_4c0,(shaderexecutor *)&local_2a8,(FloatFormat *)local_1a8,pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_570._4_4_,local_570._0_4_) != &local_560) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_570._4_4_,local_570._0_4_),
                            local_560._M_allocated_capacity + 1);
          }
          if ((IVal *)local_528._0_8_ != (IVal *)(local_528 + 0x10)) {
            operator_delete((void *)local_528._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_518._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_420);
        }
      }
      local_530 = local_530 + 1;
    } while (local_530 != local_4a0);
    iVar15 = (int)local_540;
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_0097ea49;
    }
    else {
      poVar3 = (ostringstream *)(local_498 + 8);
      local_498._0_8_ = local_550;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_420);
    }
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar15);
    pTVar25 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    local_498._0_8_ = local_498 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    p_Var23 = (_Base_ptr)
              (CONCAT44(local_498._12_4_,local_498._8_4_) +
              CONCAT44(local_528._12_4_,local_528._8_4_));
    p_Var24 = (_Base_ptr)0xf;
    if ((IVal *)local_528._0_8_ != (IVal *)(local_528 + 0x10)) {
      p_Var24 = (_Base_ptr)local_518._0_8_;
    }
    if (p_Var24 < p_Var23) {
      p_Var24 = (_Base_ptr)0xf;
      if ((IVal *)local_498._0_8_ != (IVal *)(local_498 + 0x10)) {
        p_Var24 = (_Base_ptr)
                  CONCAT44(local_488._M_allocated_capacity._4_4_,
                           local_488._M_allocated_capacity._0_4_);
      }
      if (p_Var24 < p_Var23) goto LAB_0097ea3a;
      plVar20 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_498,0,(char *)0x0,local_528._0_8_);
    }
    else {
LAB_0097ea3a:
      plVar20 = (long *)std::__cxx11::string::_M_append(local_528,local_498._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pTVar1 = (TestLog *)(plVar20 + 2);
    if ((TestLog *)*plVar20 == pTVar1) {
      local_1a8._16_8_ = pTVar1->m_log;
      local_1a8._24_8_ = plVar20[3];
    }
    else {
      local_1a8._16_8_ = pTVar1->m_log;
      local_1a8._0_8_ = (TestLog *)*plVar20;
    }
    local_1a8._8_8_ = plVar20[1];
    *plVar20 = (long)pTVar1;
    plVar20[1] = 0;
    *(undefined1 *)&pTVar1->m_log = 0;
    pTVar25->m_code = QP_TEST_RESULT_FAIL;
    (pTVar25->m_description)._M_dataplus._M_p = (pointer)&(pTVar25->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar25->m_description,local_1a8._0_8_,
               (undefined1 *)((long)(qpTestLog **)local_1a8._0_8_ + local_1a8._8_8_));
    if ((TestLog *)local_1a8._0_8_ != (TestLog *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)(deUint32 *)local_1a8._16_8_ + 1));
    }
    if ((IVal *)local_498._0_8_ != (IVal *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,
                      CONCAT44(local_488._M_allocated_capacity._4_4_,
                               local_488._M_allocated_capacity._0_4_) + 1);
    }
    p_Var23 = (_Base_ptr)local_518._0_8_;
    pIVar18 = (IVal *)local_528._0_8_;
    if ((IVal *)local_528._0_8_ == (IVal *)(local_528 + 0x10)) goto LAB_0097ec30;
  }
  operator_delete(pIVar18,(ulong)((long)&p_Var23->_M_color + 1));
LAB_0097ec30:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_318);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar25;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}